

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import-utils.h
# Opt level: O0

Index __thiscall wasm::ImportInfo::getNumImports(ImportInfo *this)

{
  Index IVar1;
  Index IVar2;
  Index IVar3;
  Index IVar4;
  Index IVar5;
  ImportInfo *this_local;
  
  IVar1 = getNumImportedGlobals(this);
  IVar2 = getNumImportedFunctions(this);
  IVar3 = getNumImportedTags(this);
  IVar4 = getNumImportedMemories(this);
  IVar5 = getNumImportedTables(this);
  return IVar1 + IVar2 + IVar3 + IVar4 + IVar5;
}

Assistant:

Index getNumImports() {
    return getNumImportedGlobals() + getNumImportedFunctions() +
           getNumImportedTags() + getNumImportedMemories() +
           getNumImportedTables();
  }